

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,string *file,string *srcDir,string *binDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pRVar2;
  cmCTest *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  size_type *psVar9;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string checkDir;
  string fFile;
  string relPath;
  string fSrcDir;
  string ndc;
  string fileDir;
  string fBinDir;
  ostringstream cmCTestLog_msg;
  string local_2a8;
  string local_288;
  string local_268;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined7 uStack_237;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar4 = IsFilteredOut(this,file);
  if (bVar4) {
LAB_0016e7d8:
    bVar4 = false;
  }
  else {
    pRVar2 = (this->CustomCoverageExcludeRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->CustomCoverageExcludeRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar2;
        this_00 = this_00 + 1) {
      bVar4 = cmsys::RegularExpression::find(this_00,(file->_M_dataplus)._M_p,&this_00->regmatch);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  File ",7);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(file->_M_dataplus)._M_p,file->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," is excluded in CTestCustom.ctest",0x21);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0xca,local_228._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        goto LAB_0016e7d8;
      }
    }
    cmsys::SystemTools::CollapseFullPath(&local_228,srcDir);
    cmsys::SystemTools::CollapseFullPath(&local_1c8,binDir);
    cmsys::SystemTools::CollapseFullPath(&local_268,file);
    bVar4 = cmsys::SystemTools::IsSubDirectory(&local_268,&local_228);
    bVar5 = cmsys::SystemTools::IsSubDirectory(&local_268,&local_1c8);
    cmsys::SystemTools::GetFilenamePath(&local_1e8,&local_268);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    if ((bVar4 && bVar5) || (bVar5 || bVar4)) {
      std::__cxx11::string::_M_assign((string *)&local_288);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,".NoDartCoverage","");
    cmSystemTools::FileExistsInParentDirectories
              (&local_208,(string *)local_1a8,&local_268,&local_288);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_208._M_string_length == 0) {
      local_240 = 0;
      local_238 = '\0';
      local_248 = &local_238;
      if (local_288._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_248);
      }
      else {
        cmSystemTools::RelativePath((string *)local_1a8,&local_288,&local_268);
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if ((local_288._M_string_length == local_228._M_string_length) &&
         (local_288._M_string_length != 0)) {
        bcmp(local_288._M_dataplus._M_p,local_228._M_dataplus._M_p,local_288._M_string_length);
      }
      std::__cxx11::string::_M_assign((string *)&local_288);
      paVar1 = &local_2a8.field_2;
      local_2a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,local_288._M_dataplus._M_p,
                 local_288._M_dataplus._M_p + local_288._M_string_length);
      std::__cxx11::string::append((char *)&local_2a8);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_248);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar9) {
        local_1a8._16_8_ = *psVar9;
        local_1a8._24_8_ = plVar8[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar9;
        local_1a8._0_8_ = (size_type *)*plVar8;
      }
      local_1a8._8_8_ = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_268);
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((local_1e8._M_string_length != local_268._M_string_length) ||
         ((bVar4 = true, local_1e8._M_string_length != 0 &&
          (iVar6 = bcmp(local_1e8._M_dataplus._M_p,local_268._M_dataplus._M_p,
                        local_1e8._M_string_length), iVar6 != 0)))) {
        local_2a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,".NoDartCoverage","");
        cmSystemTools::FileExistsInParentDirectories
                  ((string *)local_1a8,&local_2a8,&local_268,&local_288);
        std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if (local_208._M_string_length == 0) {
          bVar4 = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," so skip coverage of: ",0x16);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(file->_M_dataplus)._M_p,file->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x10a,local_2a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar4 = false;
        }
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," so skip coverage of ",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0xea,local_248,(this->super_cmCTestGenericHandler).Quiet);
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(std::string const& file,
                                               std::string const& srcDir,
                                               std::string const& binDir)
{
  if (this->IsFilteredOut(file)) {
    return false;
  }

  for (cmsys::RegularExpression& rx : this->CustomCoverageExcludeRegex) {
    if (rx.find(file)) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "  File " << file << " is excluded in CTestCustom.ctest" << std::endl;
        , this->Quiet);
      return false;
    }
  }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile, fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile, fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if (sourceSubDir && buildSubDir) {
    if (fSrcDir.size() > fBinDir.size()) {
      checkDir = fSrcDir;
    } else {
      checkDir = fBinDir;
    }
  } else if (sourceSubDir) {
    checkDir = fSrcDir;
  } else if (buildSubDir) {
    checkDir = fBinDir;
  }
  std::string ndc = cmSystemTools::FileExistsInParentDirectories(
    ".NoDartCoverage", fFile, checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if (!checkDir.empty()) {
    relPath = cmSystemTools::RelativePath(checkDir, fFile);
  } else {
    relPath = fFile;
  }
  if (checkDir == fSrcDir) {
    checkDir = fBinDir;
  } else {
    checkDir = fSrcDir;
  }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if (fileDir == fFile) {
    // This is in-source build, so we trust the previous check.
    return true;
  }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage", fFile,
                                                     checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of: " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}